

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem02.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  void *this;
  long local_30;
  long n;
  long o;
  long oo;
  long sum;
  
  oo = 2;
  n = 2;
  local_30 = 3;
  while ((double)local_30 <= 4000000.0) {
    if (local_30 % 2 == 0) {
      oo = local_30 + oo;
    }
    lVar1 = local_30;
    local_30 = local_30 + n;
    n = lVar1;
  }
  this = (void *)std::ostream::operator<<(&std::cout,oo);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    long sum=2;
    long oo=1;
    long o=2;
    long n=3;
    while (n<=4e6) {
        if (n%2==0) sum+=n;
        oo=o;
        o=n;

        n=o+oo;
    }

    cout<<sum<<endl;
}